

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O1

int adiak_get_subval(adiak_datatype_t *t,adiak_value_t *val,int elem,adiak_datatype_t **subtype,
                    adiak_value_t *subval)

{
  adiak_type_t aVar1;
  adiak_datatype_t *paVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  adiak_value_t aVar8;
  ulong uVar9;
  adiak_datatype_t **ppaVar10;
  bool bVar11;
  
  if (elem < 0) {
LAB_00117fe4:
    *subtype = (adiak_datatype_t *)0x0;
    subval->v_long = 0;
LAB_00117fec:
    iVar4 = -1;
  }
  else {
    if (t->is_reference == 0) {
      if (elem < t->num_elements) {
        uVar9 = 0;
        if (t->dtype == adiak_tuple) {
          uVar9 = (ulong)(uint)elem;
        }
        *subtype = t->subtype[uVar9];
        aVar8 = *(adiak_value_t *)((long)val->v_ptr + (ulong)(uint)elem * 8);
        goto switchD_00118020_caseD_c;
      }
      goto LAB_00117fe4;
    }
    if (t->num_ref_elements <= elem) goto LAB_00117fe4;
    if (t->dtype == adiak_tuple) {
      uVar9 = (ulong)(uint)elem;
      bVar11 = elem != 0;
      if (elem == 0) {
        iVar5 = 0;
      }
      else {
        ppaVar10 = t->subtype;
        iVar4 = calc_size(*ppaVar10);
        iVar5 = 0;
        if (-1 < iVar4) {
          uVar3 = 1;
          iVar5 = iVar4;
          do {
            uVar7 = uVar3;
            if (uVar9 == uVar7) break;
            iVar6 = calc_size(ppaVar10[uVar7]);
            iVar4 = 0;
            if (-1 < iVar6) {
              iVar4 = iVar6;
            }
            iVar5 = iVar5 + iVar4;
            uVar3 = uVar7 + 1;
          } while (-1 < iVar6);
          bVar11 = uVar7 < uVar9;
        }
      }
      if (bVar11) goto LAB_00117fe4;
      ppaVar10 = t->subtype + uVar9;
    }
    else {
      ppaVar10 = t->subtype;
      iVar5 = calc_size(*ppaVar10);
      iVar5 = iVar5 * elem;
      if (iVar5 < 0) goto LAB_00117fe4;
    }
    paVar2 = *ppaVar10;
    *subtype = paVar2;
    aVar1 = paVar2->dtype;
    iVar4 = 0;
    if (adiak_ulonglong < aVar1) {
      return 0;
    }
    aVar8.v_ptr = (long)iVar5 + val->v_ptr;
    switch(aVar1) {
    case adiak_type_unset:
      subval->v_long = 0;
      goto LAB_00117fec;
    default:
      aVar8 = *aVar8.v_subval;
    case adiak_range:
    case adiak_set:
    case adiak_list:
    case adiak_tuple:
switchD_00118020_caseD_c:
      iVar4 = 0;
      subval->v_subval = (adiak_value_t *)aVar8;
      break;
    case adiak_int:
    case adiak_uint:
      subval->v_int = *aVar8;
      break;
    case adiak_double:
      *subval = (adiak_value_t)*aVar8.v_long;
    }
  }
  return iVar4;
}

Assistant:

int adiak_get_subval(adiak_datatype_t* t, adiak_value_t* val, int elem, adiak_datatype_t** subtype, adiak_value_t* subval)
{
   /* Return if this is not a container type or we're out-of-bounds. */
   if (elem < 0)
      goto error;

   /* Adiak-owned data:
    * Data is in val->v_subval. Simply return the selected subvalue.
    */
   if (!t->is_reference) {
      if (elem >= t->num_elements)
         goto error;
      *subtype = (t->dtype == adiak_tuple ? t->subtype[elem] : t->subtype[0]);
      *subval = val->v_subval[elem];
      return 0;
   }

   /* Zero-copy data:
    * Data is in val->v_ptr. Make a adiak_value_t for the selected subvalue.
    */

   if (elem >= t->num_ref_elements)
      goto error;

   /* Compute offset of the selected subvalue. */
   int bytes = 0;
   if (t->dtype == adiak_tuple) {
      for (int n = 0; n < elem; ++n) {
         int s = calc_size(t->subtype[n]);
         if (s < 0)
            goto error;
         bytes += s;
      }
      *subtype = t->subtype[elem];
   } else {
      bytes = elem * calc_size(t->subtype[0]);
      if (bytes < 0)
         goto error;
      *subtype = t->subtype[0];
   }

   unsigned char* ptr = ((unsigned char*) val->v_ptr) + bytes;

   switch ((*subtype)->dtype) {
      case adiak_type_unset:
         (*subval).v_ptr = NULL;
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         (*subval).v_long = *((long *) ptr);
         break;
      case adiak_longlong:
      case adiak_ulonglong:
         (*subval).v_longlong = *((long long *) ptr);
         break;
      case adiak_int:
      case adiak_uint:
         (*subval).v_int = *((int *) ptr);
         break;
      case adiak_double:
         (*subval).v_double = *((double *) ptr);
         break;
      case adiak_timeval:
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         (*subval).v_ptr = *((void**) ptr);
         break;
      case adiak_range:
      case adiak_set:
      case adiak_list:
      case adiak_tuple:
         (*subval).v_ptr = (void*) ptr;
         break;
   }

   return 0;

error:
   *subtype = NULL;
   (*subval).v_ptr = NULL;
   return -1;
}